

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EntityMarking::Encode(EntityMarking *this,KDataStream *stream)

{
  ushort local_1a;
  KUINT16 i;
  KDataStream *stream_local;
  EntityMarking *this_local;
  
  KDataStream::operator<<(stream,this->m_ui8EntityMarkingCharacterSet);
  for (local_1a = 0; local_1a < 0xb; local_1a = local_1a + 1) {
    KDataStream::operator<<(stream,this->m_sEntityMarkingString[local_1a]);
  }
  return;
}

Assistant:

void EntityMarking::Encode( KDataStream & stream ) const
{
    stream << m_ui8EntityMarkingCharacterSet;

    for( KUINT16 i = 0; i < 11; ++i )
    {
        stream << m_sEntityMarkingString[i];
    }
}